

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

bool __thiscall csv::CSVReader::read_row(CSVReader *this,CSVRow *row)

{
  ThreadSafeDeque<csv::CSVRow> *this_00;
  _Elt_pointer pCVar1;
  _Elt_pointer pCVar2;
  ulong uVar3;
  runtime_error *this_01;
  char *in_R8;
  string_view delim;
  string_view delim_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  string local_98;
  CSVRow errored_row;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  while( true ) {
    while( true ) {
      this_00 = (this->records)._M_t.
                super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
                _M_head_impl;
      pCVar1 = ((iterator *)
               ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>
               + 0x10))->_M_cur;
      pCVar2 = ((iterator *)
               ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>
               + 0x30))->_M_cur;
      if (pCVar2 != pCVar1) break;
      if (this_00->_is_waitable == true) {
        internals::ThreadSafeDeque<csv::CSVRow>::wait(this_00,this_00);
      }
      else {
        if (((this->parser)._M_t.
             super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
             ._M_t.
             super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
             .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl)->_eof !=
            false) goto LAB_00105b60;
        if ((this->read_csv_worker)._M_id._M_thread != 0) {
          std::thread::join();
        }
        errored_row.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)read_csv;
        errored_row.data.super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_98._M_dataplus._M_p = (pointer)this;
        std::thread::
        thread<bool(csv::CSVReader::*)(unsigned_long),csv::CSVReader*,unsigned_long_const&,void>
                  ((thread *)&local_50,(type *)&errored_row,(CSVReader **)&local_98,
                   &internals::ITERATION_CHUNK_SIZE);
        std::thread::operator=(&this->read_csv_worker,(thread *)&local_50);
        std::thread::~thread((thread *)&local_50);
      }
    }
    if ((pCVar1->row_length == this->n_cols) || ((this->_format).variable_column_policy == KEEP))
    break;
    internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&errored_row,this_00);
    if ((this->_format).variable_column_policy == THROW) {
      uVar3 = this->n_cols;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      if (errored_row.row_length < uVar3) {
        CSVRow::operator_cast_to_vector(&local_b0,&errored_row);
        delim._M_str = in_R8;
        delim._M_len = (size_t)", ";
        internals::format_row
                  (&local_98,(internals *)&local_b0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x2,delim);
        std::operator+(&local_50,"Line too short ",&local_98);
        std::runtime_error::runtime_error(this_01,(string *)&local_50);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      CSVRow::operator_cast_to_vector(&local_b0,&errored_row);
      delim_00._M_str = in_R8;
      delim_00._M_len = (size_t)", ";
      internals::format_row
                (&local_98,(internals *)&local_b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x2,delim_00);
      std::operator+(&local_50,"Line too long ",&local_98);
      std::runtime_error::runtime_error(this_01,(string *)&local_50);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&errored_row.data.
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&errored_row,this_00);
  CSVRow::operator=(row,&errored_row);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&errored_row.data.
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  this->_n_rows = this->_n_rows + 1;
LAB_00105b60:
  return pCVar2 != pCVar1;
}

Assistant:

CSV_INLINE bool CSVReader::read_row(CSVRow &row) {
        while (true) {
            if (this->records->empty()) {
                if (this->records->is_waitable())
                    // Reading thread is currently active => wait for it to populate records
                    this->records->wait();
                else if (this->parser->eof())
                    // End of file and no more records
                    return false;
                else {
                    // Reading thread is not active => start another one
                    if (this->read_csv_worker.joinable())
                        this->read_csv_worker.join();

                    this->read_csv_worker = std::thread(&CSVReader::read_csv, this, internals::ITERATION_CHUNK_SIZE);
                }
            }
            else if (this->records->front().size() != this->n_cols &&
                this->_format.variable_column_policy != VariableColumnPolicy::KEEP) {
                auto errored_row = this->records->pop_front();

                if (this->_format.variable_column_policy == VariableColumnPolicy::THROW) {
                    if (errored_row.size() < this->n_cols)
                        throw std::runtime_error("Line too short " + internals::format_row(errored_row));

                    throw std::runtime_error("Line too long " + internals::format_row(errored_row));
                }
            }
            else {
                row = this->records->pop_front();
                this->_n_rows++;
                return true;
            }
        }

        return false;
    }